

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_dispatcher_template.hpp
# Opt level: O3

void __thiscall
so_5::disp::reuse::
proxy_dispatcher_template_t<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>,so_5::disp::thread_pool::disp_params_t>
::
make_actual_dispatcher<so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>,so_5::environment_t,unsigned_long,so_5::disp::mpmc_queue_traits::queue_params_t_const&>
          (proxy_dispatcher_template_t<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>,so_5::disp::thread_pool::disp_params_t>
           *this,environment_t *env,unsigned_long *args,queue_params_t *args_1)

{
  long *plVar1;
  long *plVar2;
  long *local_20;
  
  stats::activity_tracking_stuff::
  create_appropriate_disp<so_5::disp::thread_pool::common_implementation::ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>,so_5::environment_t,so_5::disp::thread_pool::disp_params_t,unsigned_long,so_5::disp::mpmc_queue_traits::queue_params_t_const&>
            ((activity_tracking_stuff *)&local_20,env,(disp_params_t *)(this + 0x10),args,args_1);
  (**(code **)(*local_20 + 0x28))(local_20,this + 0x48);
  (**(code **)(*local_20 + 0x10))(local_20,env);
  plVar2 = local_20;
  local_20 = (long *)0x0;
  plVar1 = *(long **)(this + 8);
  *(long **)(this + 8) = plVar2;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
    if (local_20 != (long *)0x0) {
      (**(code **)(*local_20 + 8))();
    }
  }
  return;
}

Assistant:

void
		make_actual_dispatcher(
			ENV & env,
			ARGS && ...args )
			{
				using so_5::stats::activity_tracking_stuff::create_appropriate_disp;
				auto disp = create_appropriate_disp<
						DISP_IFACE_TYPE,
						DISP_NO_TRACKING,
						DISP_WITH_TRACKING >(
					env,
					m_disp_params,
					std::forward<ARGS>(args)... );

				disp->set_data_sources_name_base( m_data_source_base_name );
				disp->start( env );

				m_disp = std::move( disp );
			}